

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
AddressFixture_Decrement_Test::~AddressFixture_Decrement_Test(AddressFixture_Decrement_Test *this)

{
  AddressFixture_Decrement_Test *this_local;
  
  ~AddressFixture_Decrement_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (AddressFixture, Decrement) {
    {
        // Pre-decrement
        auto a1 = pstore::address{1};
        auto r1 = --a1;
        EXPECT_EQ (pstore::address::null (), a1);
        EXPECT_EQ (pstore::address::null (), r1);
    }
    {
        // Post-decrement
        auto a2 = pstore::address{1};
        auto r2 = a2--;
        EXPECT_EQ (pstore::address::null (), a2);
        EXPECT_EQ ((pstore::address{1}), r2);
    }
}